

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86logging.cpp
# Opt level: O3

Error asmjit::X86Logging::formatRegister
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,uint32_t archType,
                uint32_t rType,uint32_t rId)

{
  Error EVar1;
  undefined8 in_RAX;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  
  if (rId < 0x100) {
    if (rType < 0x20) {
      uVar2 = (ulong)rType;
      if (rId < (byte)x86RegFormatInfo[uVar2 * 4 + 3]) {
        pcVar4 = x86RegFormatStrings + (ulong)rId * 4 + (ulong)(byte)x86RegFormatInfo[uVar2 * 4 + 2]
        ;
LAB_0017ad53:
        EVar1 = StringBuilder::_opString(sb,1,pcVar4,0xffffffffffffffff);
        return EVar1;
      }
      if (rId < (byte)x86RegFormatInfo[uVar2 * 4]) {
        uVar3 = (ulong)rId;
        pcVar4 = x86RegFormatStrings + (byte)x86RegFormatInfo[uVar2 * 4 + 1];
LAB_0017ada3:
        EVar1 = StringBuilder::appendFormat(sb,pcVar4,uVar3,in_RAX);
        return EVar1;
      }
    }
    pcVar4 = "PhysReg<Type=%u Id=%u>";
  }
  else {
    if (((emitter != (CodeEmitter *)0x0) && (emitter->_type == '\x03')) &&
       (uVar3 = (ulong)(rId - 0x100), uVar3 < emitter[3]._none.field_0._packed[0].u64)) {
      if (rId == 0xffffffff) {
        formatRegister();
      }
      else if (*(long *)(emitter[3]._inlineComment + uVar3 * 8) != 0) {
        pcVar4 = *(char **)(*(long *)(emitter[3]._inlineComment + uVar3 * 8) + 8);
        if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\0')) {
          pcVar4 = "v%u";
          goto LAB_0017ada3;
        }
        goto LAB_0017ad53;
      }
      formatRegister();
    }
    pcVar4 = "VirtReg<Type=%u Id=%u>";
  }
  EVar1 = StringBuilder::appendFormat(sb,pcVar4,rType,(ulong)rId,in_RAX);
  return EVar1;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Logging::formatRegister(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  uint32_t archType,
  uint32_t rType,
  uint32_t rId) noexcept {

  ASMJIT_UNUSED(logOptions);
  ASMJIT_UNUSED(archType);

  if (Operand::isPackedId(rId)) {
#if !defined(ASMJIT_DISABLE_COMPILER)
    if (emitter && emitter->getType() == CodeEmitter::kTypeCompiler) {
      const CodeCompiler* cc = static_cast<const CodeCompiler*>(emitter);

      if (cc->isVirtRegValid(rId)) {
        VirtReg* vReg = cc->getVirtRegById(rId);
        ASMJIT_ASSERT(vReg != nullptr);

        const char* name = vReg->getName();
        if (name && name[0] != '\0')
          return sb.appendString(name);
        else
          return sb.appendFormat("v%u", static_cast<unsigned int>(Operand::unpackId(rId)));
      }
    }
#endif // !ASMJIT_DISABLE_COMPILER

    return sb.appendFormat("VirtReg<Type=%u Id=%u>", rType, rId);
  }
  else {
    if (rType < ASMJIT_ARRAY_SIZE(x86RegFormatInfo)) {
      const X86RegFormatInfo& rfi = x86RegFormatInfo[rType];

      if (rId < rfi.specialCount)
        return sb.appendString(x86RegFormatStrings + rfi.specialIndex + rId * 4);

      if (rId < rfi.count)
        return sb.appendFormat(x86RegFormatStrings + rfi.formatIndex, static_cast<unsigned int>(rId));
    }

    return sb.appendFormat("PhysReg<Type=%u Id=%u>", rType, rId);
  }
}